

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O3

uchar * cppcms::b64url::encode(uchar *begin,uchar *end,uchar *target)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  for (uVar1 = (long)end - (long)begin; 2 < (long)uVar1; uVar1 = uVar1 - 3) {
    *target = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[*begin >> 2];
    target[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"
                [(uint)(begin[1] >> 4) | (*begin & 3) << 4];
    target[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"
                [(uint)(begin[2] >> 6) + (begin[1] & 0xf) * 4];
    target[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[begin[2] & 0x3f];
    begin = begin + 3;
    target = target + 4;
  }
  if (begin != end) {
    *target = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[*begin >> 2];
    uVar3 = (ulong)((*begin & 3) << 4);
    if (uVar1 < 2) {
      lVar2 = 2;
      lVar4 = 1;
    }
    else {
      target[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"
                  [begin[1] >> 4 | uVar3];
      uVar3 = (ulong)((begin[1] & 0xf) << 2);
      if (uVar1 == 2) {
        lVar2 = 3;
        lVar4 = 2;
      }
      else {
        target[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"
                    [begin[2] >> 6 | uVar3];
        uVar3 = (ulong)(begin[2] & 0x3f);
        lVar2 = 4;
        lVar4 = 3;
      }
    }
    target[lVar4] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[uVar3];
    target = target + lVar2;
  }
  return target;
}

Assistant:

unsigned char *encode(unsigned char const *begin,unsigned char const *end,unsigned char *target)
{
	while(end - begin >=3) {
		bencode(begin,target,3);
		begin += 3;
		target += 4;
	}
	if(end!=begin)
		target+=bencode(begin,target,end-begin);
	return target;
}